

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# all_codim_mesh_data_set.h
# Opt level: O0

void __thiscall
lf::mesh::utils::AllCodimMeshDataSet<bool>::AllCodimMeshDataSet<bool,void>
          (AllCodimMeshDataSet<bool> *this,shared_ptr<const_lf::mesh::Mesh> *mesh,bool init_value)

{
  dim_t dVar1;
  uint uVar2;
  element_type *peVar3;
  reference this_00;
  vector<bool,_void,_void> local_48;
  uint local_30;
  dim_t codim;
  bool local_19;
  __shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false> *p_Stack_18;
  bool init_value_local;
  shared_ptr<const_lf::mesh::Mesh> *mesh_local;
  AllCodimMeshDataSet<bool> *this_local;
  
  (this->super_MeshDataSet<bool>)._vptr_MeshDataSet = (_func_int **)0x0;
  local_19 = init_value;
  p_Stack_18 = (__shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)mesh;
  mesh_local = (shared_ptr<const_lf::mesh::Mesh> *)this;
  MeshDataSet<bool>::MeshDataSet(&this->super_MeshDataSet<bool>);
  (this->super_MeshDataSet<bool>)._vptr_MeshDataSet = (_func_int **)&PTR_operator___008c6168;
  peVar3 = std::__shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->(p_Stack_18);
  dVar1 = (**peVar3->_vptr_Mesh)();
  this->dim_mesh_ = dVar1;
  std::shared_ptr<const_lf::mesh::Mesh>::shared_ptr
            (&this->mesh_,(shared_ptr<const_lf::mesh::Mesh> *)p_Stack_18);
  boost::container::vector<boost::container::vector<bool,_void,_void>,_void,_void>::vector
            (&this->data_,(ulong)(this->dim_mesh_ + 1));
  for (local_30 = 0; local_30 <= this->dim_mesh_; local_30 = local_30 + 1) {
    peVar3 = std::
             __shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->mesh_);
    uVar2 = (*peVar3->_vptr_Mesh[3])(peVar3,(ulong)local_30);
    boost::container::vector<bool,_void,_void>::vector(&local_48,(ulong)uVar2,&local_19);
    this_00 = boost::container::vector<boost::container::vector<bool,_void,_void>,_void,_void>::
              operator[](&this->data_,(ulong)local_30);
    boost::container::vector<bool,_void,_void>::operator=(this_00,&local_48);
    boost::container::vector<bool,_void,_void>::~vector(&local_48);
  }
  return;
}

Assistant:

AllCodimMeshDataSet(const std::shared_ptr<const lf::mesh::Mesh>& mesh,
                      X init_value)
      : MeshDataSet<T>(),
        dim_mesh_(mesh->DimMesh()),
        mesh_(mesh),
        data_(dim_mesh_ + 1) {
    for (dim_t codim = 0; codim <= dim_mesh_; ++codim) {
      data_[codim] =
          boost::container::vector<T>(mesh_->NumEntities(codim), init_value);
    }
  }